

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O2

int mbedtls_ssl_handle_pending_alert(mbedtls_ssl_context *ssl)

{
  int iVar1;
  int iVar2;
  
  if (ssl->send_alert != '\0') {
    iVar1 = mbedtls_ssl_send_alert_message(ssl,'\x02',ssl->alert_type);
    iVar2 = -0x6880;
    if ((iVar1 != -0x6880) && (ssl->send_alert = '\0', iVar2 = iVar1, iVar1 == 0)) {
      iVar2 = ssl->alert_reason;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_handle_pending_alert(mbedtls_ssl_context *ssl)
{
    int ret;

    /* No pending alert, return success*/
    if (ssl->send_alert == 0) {
        return 0;
    }

    ret = mbedtls_ssl_send_alert_message(ssl,
                                         MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                         ssl->alert_type);

    /* If mbedtls_ssl_send_alert_message() returned with MBEDTLS_ERR_SSL_WANT_WRITE,
     * do not clear the alert to be able to send it later.
     */
    if (ret != MBEDTLS_ERR_SSL_WANT_WRITE) {
        ssl->send_alert = 0;
    }

    if (ret != 0) {
        return ret;
    }

    return ssl->alert_reason;
}